

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteExprList(WatWriter *this,ExprList *exprs)

{
  undefined1 local_78 [8];
  ExprVisitor visitor;
  ExprVisitorDelegate delegate;
  ExprList *exprs_local;
  WatWriter *this_local;
  
  ExprVisitorDelegate::ExprVisitorDelegate
            ((ExprVisitorDelegate *)
             &visitor.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
  ExprVisitor::ExprVisitor
            ((ExprVisitor *)local_78,
             (Delegate *)
             &visitor.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ExprVisitor::VisitExprList((ExprVisitor *)local_78,exprs);
  ExprVisitor::~ExprVisitor((ExprVisitor *)local_78);
  ExprVisitorDelegate::~ExprVisitorDelegate
            ((ExprVisitorDelegate *)
             &visitor.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void WatWriter::WriteExprList(const ExprList& exprs) {
  WABT_TRACE(WriteExprList);
  ExprVisitorDelegate delegate(this);
  ExprVisitor visitor(&delegate);
  visitor.VisitExprList(const_cast<ExprList&>(exprs));
}